

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O2

bool __thiscall
YAML::EmitterState::SetBoolLengthFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  if (value - LongBool < 2) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_boolLengthFmt,value,scope);
  }
  return value - LongBool < 2;
}

Assistant:

bool EmitterState::SetBoolLengthFormat(EMITTER_MANIP value,
                                       FmtScope::value scope) {
  switch (value) {
    case LongBool:
    case ShortBool:
      _Set(m_boolLengthFmt, value, scope);
      return true;
    default:
      return false;
  }
}